

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O0

double TasGrid::RuleLocal::evalPWCubic<(TasGrid::RuleLocal::erule)4>(int point,double x)

{
  undefined8 local_30;
  double x_local;
  double dStack_10;
  int point_local;
  
  if (point == 0) {
    dStack_10 = 1.0 - x;
  }
  else if (point == 1) {
    dStack_10 = x + 1.0;
  }
  else if (point == 2) {
    dStack_10 = (1.0 - x) * (x + 1.0);
  }
  else {
    if (point % 2 == 0) {
      local_30 = (1.0 - x) * (x + 1.0) * (x + 3.0);
    }
    else {
      local_30 = (1.0 - x) * (x + 1.0) * (3.0 - x);
    }
    local_30 = local_30 / 3.0;
    dStack_10 = local_30;
  }
  return dStack_10;
}

Assistant:

double evalPWCubic(int point, double x) {
        if (effective_rule == erule::localp){
            switch(point) {
                case 0: return 1.0;
                case 1: return 1.0 - x;
                case 2: return 1.0 + x;
                case 3:
                case 4: return (1.0 - x) * (1.0 + x);
                default:
                    return (point % 2 == 0) ? (1.0 - x) * (1.0 + x) * (3.0 + x) / 3.0 : (1.0 - x) * (1.0 + x) * (3.0 - x) / 3.0;
            };
        }else if (effective_rule == erule::localp0){
            if (point == 0) return (1.0 - x) * (1.0 + x);
        }else if (effective_rule == erule::localpb){
            switch(point) {
                case 0: return 1.0 - x;
                case 1: return 1.0 + x;
                case 2: return (1.0 - x) * (1.0 + x);
                default:
                    return (point % 2 == 0) ? (1.0 - x) * (1.0 + x) * (3.0 + x) / 3.0 : (1.0 - x) * (1.0 + x) * (3.0 - x) / 3.0;
            };
        }
        return (point % 2 == 0) ? (1.0 - x) * (1.0 + x) * (3.0 + x) / 3.0 : (1.0 - x) * (1.0 + x) * (3.0 - x) / 3.0;
    }